

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O0

void __thiscall
ktx::CommandExtract::saveImageFile
          (CommandExtract *this,string *filepath,bool appendExtension,char *data,size_t size,
          VkFormat vkFormat,FormatDescriptor *format,uint32_t width,uint32_t height)

{
  initializer_list<int> __l;
  byte in_DL;
  string *in_RSI;
  vector<int,_std::allocator<int>_> *in_R8;
  int in_R9D;
  undefined8 in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000018;
  uint32_t in_stack_00000044;
  FormatDescriptor *in_stack_00000048;
  VkFormat in_stack_00000050;
  bool in_stack_00000057;
  string *in_stack_00000058;
  CommandExtract *in_stack_00000060;
  uint32_t in_stack_00000070;
  char *in_stack_00000078;
  undefined4 in_stack_00000080;
  uint32_t in_stack_00000084;
  FormatDescriptor *in_stack_00000088;
  VkFormat in_stack_00000090;
  bool in_stack_00000097;
  string *in_stack_00000098;
  CommandExtract *in_stack_000000a0;
  uint32_t in_stack_000000b0;
  vector<int,_std::allocator<int>_> *in_stack_000000b8;
  char *in_stack_000000c0;
  size_t in_stack_000000c8;
  allocator_type *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  char (*in_stack_fffffffffffffba8) [54];
  undefined8 in_stack_fffffffffffffbb0;
  ReturnCode return_code;
  Reporter *in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbe0;
  uint32_t width_00;
  string *psVar2;
  FormatDescriptor *in_stack_fffffffffffffbe8;
  FormatDescriptor *format_00;
  undefined8 in_stack_fffffffffffffbf0;
  string *in_stack_fffffffffffffbf8;
  string *filepath_00;
  CommandExtract *in_stack_fffffffffffffc00;
  CommandExtract *this_00;
  uint32_t in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc18;
  char *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  string local_3a0 [40];
  undefined4 local_378;
  undefined4 local_374;
  undefined4 *local_370;
  undefined8 local_368;
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [28];
  uint32_t in_stack_fffffffffffffd54;
  FormatDescriptor *in_stack_fffffffffffffd58;
  VkFormat in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  string *in_stack_fffffffffffffd68;
  CommandExtract *in_stack_fffffffffffffd70;
  string local_288 [8];
  uint32_t in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  size_t in_stack_fffffffffffffd90;
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [12];
  uint32_t in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  string *in_stack_fffffffffffffe78;
  CommandExtract *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe90;
  pointer in_stack_fffffffffffffe98;
  pointer in_stack_fffffffffffffea0;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [48];
  string local_58 [63];
  byte local_19;
  
  return_code = (ReturnCode)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
  width_00 = (uint32_t)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
  local_19 = in_DL & 1;
  if ((((((in_R9D == 1) || (in_R9D == 2)) || (in_R9D == 3)) || ((in_R9D == 4 || (in_R9D == 5)))) ||
      (in_R9D == 6)) || ((in_R9D == 7 || (in_R9D == 8)))) goto LAB_0026d447;
  if (in_R9D != 9) {
    if ((in_R9D == 0xd) || (in_R9D == 0xe)) {
      psVar2 = local_e8;
      std::__cxx11::string::string(psVar2,in_RSI);
      saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
              SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),(VkFormat)in_stack_fffffffffffffbf0,
              in_stack_fffffffffffffbe8,width_00,in_stack_fffffffffffffc10,in_stack_fffffffffffffc18
              ,(char *)psVar2,in_stack_fffffffffffffc28);
      std::__cxx11::string::~string(local_e8);
      return;
    }
    if ((in_R9D != 0xf) && (in_R9D != 0x10)) {
      if ((in_R9D == 0x14) || (in_R9D == 0x15)) {
        std::__cxx11::string::string(local_148,in_RSI);
        saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                (VkFormat)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,width_00,
                in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,in_stack_fffffffffffffc20,
                in_stack_fffffffffffffc28);
        std::__cxx11::string::~string(local_148);
        return;
      }
      if ((in_R9D != 0x16) && (in_R9D != 0x17)) {
        if ((in_R9D == 0x1b) || (in_R9D == 0x1c)) {
LAB_0026da2d:
          psVar2 = local_1a8;
          std::__cxx11::string::string(psVar2,in_RSI);
          saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,SUB81((ulong)psVar2 >> 0x38,0)
                  ,(VkFormat)psVar2,in_stack_fffffffffffffbe8,width_00,in_stack_fffffffffffffc10,
                  in_stack_fffffffffffffc18,in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
          std::__cxx11::string::~string(local_1a8);
          return;
        }
        if ((in_R9D != 0x1d) && (in_R9D != 0x1e)) {
          if ((in_R9D == 0x22) || (in_R9D == 0x23)) goto LAB_0026da2d;
          if ((in_R9D != 0x24) && (in_R9D != 0x25)) {
            if ((in_R9D == 0x29) || (in_R9D == 0x2a)) {
LAB_0026dc66:
              std::__cxx11::string::string(local_208,in_RSI);
              saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                      SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                      (VkFormat)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,width_00,
                      in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,in_stack_fffffffffffffc20,
                      in_stack_fffffffffffffc28);
              std::__cxx11::string::~string(local_208);
              return;
            }
            if ((in_R9D != 0x2b) && (in_R9D != 0x2c)) {
              if ((in_R9D == 0x30) || (in_R9D == 0x31)) goto LAB_0026dc66;
              if (((in_R9D != 0x32) && (in_R9D != 0x33)) && (in_R9D != 0x39)) {
                if (in_R9D != 0x3a) {
                  if ((in_R9D == 0x3e) || (in_R9D == 0x3f)) {
LAB_0026de9f:
                    std::__cxx11::string::string(local_268,in_RSI);
                    saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                            SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                            (VkFormat)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,width_00,
                            in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,
                            in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
                    std::__cxx11::string::~string(local_268);
                    return;
                  }
                  if (in_R9D != 0x40) {
                    if ((in_R9D == 0x44) || (in_R9D == 0x45)) goto LAB_0026de9f;
                    if (in_R9D != 0x46) {
                      if ((in_R9D == 0x4a) || (in_R9D == 0x4b)) {
                        psVar2 = local_108;
                        std::__cxx11::string::string(psVar2,in_RSI);
                        saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                                SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                                (VkFormat)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                                width_00,in_stack_fffffffffffffc10,(int)psVar2,
                                in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
                        std::__cxx11::string::~string(local_108);
                        return;
                      }
                      if (in_R9D != 0x4c) {
                        if (in_R9D == 0x4d) goto LAB_0026d447;
                        if ((in_R9D == 0x51) || (in_R9D == 0x52)) {
                          this_00 = (CommandExtract *)&stack0xfffffffffffffe98;
                          std::__cxx11::string::string((string *)this_00,in_RSI);
                          saveEXR(this_00,in_stack_fffffffffffffbf8,
                                  SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                                  (VkFormat)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                                  width_00,in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,
                                  in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
                          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
                          return;
                        }
                        if (in_R9D != 0x53) {
                          if (in_R9D == 0x54) goto LAB_0026d447;
                          if ((in_R9D == 0x58) || (in_R9D == 0x59)) {
                            format_00 = (FormatDescriptor *)local_1c8;
                            std::__cxx11::string::string((string *)format_00,in_RSI);
                            saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                                    SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                                    (VkFormat)in_stack_fffffffffffffbf0,format_00,width_00,
                                    in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,
                                    in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
                            std::__cxx11::string::~string(local_1c8);
                            return;
                          }
                          if (in_R9D != 0x5a) {
                            if (in_R9D == 0x5b) goto LAB_0026d447;
                            if ((in_R9D == 0x5f) || (in_R9D == 0x60)) {
                              std::__cxx11::string::string(local_228,in_RSI);
                              saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                                      SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                                      (VkFormat)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                                      width_00,in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,
                                      in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
                              std::__cxx11::string::~string(local_228);
                              return;
                            }
                            if (in_R9D != 0x61) {
                              if (in_R9D == 0x62) {
                                psVar2 = local_128;
                                std::__cxx11::string::string(psVar2,in_RSI);
                                saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                                        SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                                        (VkFormat)in_stack_fffffffffffffbf0,
                                        in_stack_fffffffffffffbe8,width_00,(uint32_t)psVar2,
                                        in_stack_fffffffffffffc18,in_stack_fffffffffffffc20,
                                        in_stack_fffffffffffffc28);
                                std::__cxx11::string::~string(local_128);
                                return;
                              }
                              if (in_R9D != 100) {
                                if (in_R9D == 0x65) {
                                  filepath_00 = (string *)&stack0xfffffffffffffe78;
                                  std::__cxx11::string::string((string *)filepath_00,in_RSI);
                                  saveEXR(in_stack_fffffffffffffc00,filepath_00,
                                          SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                                          (VkFormat)in_stack_fffffffffffffbf0,
                                          in_stack_fffffffffffffbe8,width_00,
                                          in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,
                                          in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
                                  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
                                  return;
                                }
                                if (in_R9D != 0x67) {
                                  if (in_R9D == 0x68) {
                                    psVar2 = local_1e8;
                                    std::__cxx11::string::string(psVar2,in_RSI);
                                    saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                                            SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                                            (VkFormat)in_stack_fffffffffffffbf0,
                                            in_stack_fffffffffffffbe8,
                                            (uint32_t)((ulong)psVar2 >> 0x20),
                                            in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,
                                            in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
                                    std::__cxx11::string::~string(local_1e8);
                                    return;
                                  }
                                  if (in_R9D != 0x6a) {
                                    if (in_R9D == 0x6b) {
                                      std::__cxx11::string::string(local_248,in_RSI);
                                      saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                                              SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                                              (VkFormat)in_stack_fffffffffffffbf0,
                                              in_stack_fffffffffffffbe8,width_00,
                                              in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,
                                              in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
                                      std::__cxx11::string::~string(local_248);
                                      return;
                                    }
                                    if (in_R9D != 0x6d) {
                                      if (in_R9D - 0x7aU < 2) {
                                        std::__cxx11::string::string(local_2c8,in_RSI);
                                        saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                                                SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                                                (VkFormat)in_stack_fffffffffffffbf0,
                                                in_stack_fffffffffffffbe8,width_00,
                                                in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,
                                                in_stack_fffffffffffffc20,in_stack_fffffffffffffc28)
                                        ;
                                        std::__cxx11::string::~string(local_2c8);
                                        return;
                                      }
                                      if (in_R9D == 0x7c) {
                                        std::__cxx11::string::string(local_2e8,in_RSI);
                                        savePNG(in_stack_00000060,in_stack_00000058,
                                                in_stack_00000057,in_stack_00000050,
                                                in_stack_00000048,in_stack_00000044,
                                                in_stack_00000070,in_stack_00000078,
                                                CONCAT44(in_stack_00000084,in_stack_00000080));
                                        std::__cxx11::string::~string(local_2e8);
                                        return;
                                      }
                                      if ((in_R9D == 0x7d) || (in_R9D == 0x7e)) {
                                        std::__cxx11::string::string(local_308,in_RSI);
                                        saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                                                SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                                                (VkFormat)in_stack_fffffffffffffbf0,
                                                in_stack_fffffffffffffbe8,width_00,
                                                in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,
                                                in_stack_fffffffffffffc20,in_stack_fffffffffffffc28)
                                        ;
                                        std::__cxx11::string::~string(local_308);
                                        return;
                                      }
                                      if (in_R9D == 0x7f) {
                                        std::__cxx11::string::string(local_328,in_RSI);
                                        saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                                                SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                                                (VkFormat)in_stack_fffffffffffffbf0,
                                                in_stack_fffffffffffffbe8,width_00,
                                                in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,
                                                in_stack_fffffffffffffc20,in_stack_fffffffffffffc28)
                                        ;
                                        std::__cxx11::string::~string(local_328);
                                        return;
                                      }
                                      if (((in_R9D == 0x80) || (in_R9D == 0x81)) || (in_R9D == 0x82)
                                         ) {
                                        local_58._36_4_ = in_R9D;
                                        local_58._40_8_ = in_R8;
                                        std::__cxx11::string::string(local_348,in_RSI);
                                        uVar1 = CONCAT13(local_19,(int3)in_stack_fffffffffffffb70);
                                        local_378 = 2;
                                        local_374 = 1;
                                        local_370 = &local_378;
                                        local_368 = 2;
                                        std::allocator<int>::allocator((allocator<int> *)0x26e43b);
                                        __l._M_len._0_4_ = in_stack_00000010;
                                        __l._M_array = (iterator)in_stack_00000008;
                                        __l._M_len._4_4_ = in_stack_00000018;
                                        std::vector<int,_std::allocator<int>_>::vector
                                                  ((vector<int,_std::allocator<int>_> *)
                                                   CONCAT44(local_58._36_4_,uVar1),__l,
                                                   in_stack_fffffffffffffb68);
                                        saveEXR(in_stack_000000a0,in_stack_00000098,
                                                in_stack_00000097,in_stack_00000090,
                                                in_stack_00000088,in_stack_00000084,
                                                in_stack_000000b0,in_stack_000000b8,
                                                in_stack_000000c0,in_stack_000000c8);
                                        std::vector<int,_std::allocator<int>_>::~vector
                                                  ((vector<int,_std::allocator<int>_> *)
                                                   local_58._40_8_);
                                        std::allocator<int>::~allocator((allocator<int> *)0x26e4d5);
                                        std::__cxx11::string::~string(local_348);
                                        return;
                                      }
                                      if ((((((in_R9D == 0x9d) || (in_R9D == 0x9e)) ||
                                            ((in_R9D == 0x9f ||
                                             ((in_R9D == 0xa0 || (in_R9D == 0xa1)))))) ||
                                           ((in_R9D == 0xa2 ||
                                            (((((in_R9D == 0xa3 || (in_R9D == 0xa4)) ||
                                               (in_R9D == 0xa5)) ||
                                              ((in_R9D == 0xa6 || (in_R9D == 0xa7)))) ||
                                             ((in_R9D == 0xa8 ||
                                              ((in_R9D == 0xa9 || (in_R9D == 0xaa)))))))))) ||
                                          (in_R9D == 0xab)) ||
                                         (((((((in_R9D == 0xac || (in_R9D == 0xad)) ||
                                              (in_R9D == 0xae)) ||
                                             ((in_R9D == 0xaf || (in_R9D == 0xb0)))) ||
                                            (((in_R9D == 0xb1 ||
                                              ((in_R9D == 0xb2 || (in_R9D == 0xb3)))) ||
                                             (in_R9D == 0xb4)))) ||
                                           (((in_R9D == 0xb5 || (in_R9D == 0xb6)) ||
                                            (in_R9D == 0xb7)))) || (in_R9D == 0xb8)))) {
                                        std::__cxx11::string::string(local_88,in_RSI);
                                        decodeAndSaveASTC(in_stack_fffffffffffffd70,
                                                          in_stack_fffffffffffffd68,
                                                          (bool)in_stack_fffffffffffffd67,
                                                          in_stack_fffffffffffffd60,
                                                          in_stack_fffffffffffffd58,
                                                          in_stack_fffffffffffffd54,
                                                          in_stack_fffffffffffffd80,
                                                          in_stack_fffffffffffffd88,
                                                          in_stack_fffffffffffffd90);
                                        std::__cxx11::string::~string(local_88);
                                        return;
                                      }
                                      if ((in_R9D == 0x3b9d2b60) || (in_R9D == 0x3b9d2b61)) {
LAB_0026d509:
                                        std::__cxx11::string::string(local_c8,in_RSI);
                                        unpackAndSave422(in_stack_fffffffffffffe80,
                                                         in_stack_fffffffffffffe78,
                                                         (bool)in_stack_fffffffffffffe77,
                                                         in_stack_fffffffffffffe70,
                                                         (FormatDescriptor *)
                                                         in_stack_fffffffffffffe68,
                                                         in_stack_fffffffffffffe64,
                                                         in_stack_fffffffffffffe90,
                                                         (char *)in_stack_fffffffffffffe98,
                                                         (size_t)in_stack_fffffffffffffea0);
                                        std::__cxx11::string::~string(local_c8);
                                        return;
                                      }
                                      if ((in_R9D != 0x3b9d2b67) &&
                                         ((in_R9D != 0x3b9d2b68 && (in_R9D != 0x3b9d2b69)))) {
                                        if ((in_R9D == 0x3b9d2b6a) || (in_R9D == 0x3b9d2b6b))
                                        goto LAB_0026d509;
                                        if (((in_R9D != 0x3b9d2b71) && (in_R9D != 0x3b9d2b72)) &&
                                           (in_R9D != 0x3b9d2b73)) {
                                          if (((in_R9D == 0x3b9d2b74) || (in_R9D == 0x3b9d2b75)) ||
                                             ((in_R9D == 0x3b9d2b7b || (in_R9D == 0x3b9d2b7c))))
                                          goto LAB_0026d509;
                                          if (((in_R9D != 0x3b9ffa20) && (in_R9D != 0x3b9ffa21)) &&
                                             (in_R9D != 0x3ba1f5f0)) {
                                            if (in_R9D != 0x3ba1f5f1) {
                                              toString_abi_cxx11_((VkFormat)
                                                                  ((ulong)in_stack_fffffffffffffbc0
                                                                  >> 0x20));
                                              Reporter::
                                              fatal<char_const(&)[54],std::__cxx11::string>
                                                        (in_stack_fffffffffffffbb8,return_code,
                                                         in_stack_fffffffffffffba8,
                                                         in_stack_fffffffffffffba0);
                                              std::__cxx11::string::~string(local_3a0);
                                              return;
                                            }
                                            goto LAB_0026d27d;
                                          }
                                        }
                                      }
                                      goto LAB_0026d447;
                                    }
                                  }
                                }
                              }
                              std::__cxx11::string::string
                                        ((string *)&stack0xfffffffffffffd58,in_RSI);
                              saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                                      SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                                      (VkFormat)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                                      width_00,in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,
                                      in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
                              std::__cxx11::string::~string((string *)&stack0xfffffffffffffd58);
                              return;
                            }
                          }
                        }
                      }
                      std::__cxx11::string::string(local_288,in_RSI);
                      saveEXR(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                              SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                              (VkFormat)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,width_00
                              ,in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,
                              in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
                      std::__cxx11::string::~string(local_288);
                      return;
                    }
                  }
                }
LAB_0026d447:
                std::__cxx11::string::string(local_a8,in_RSI);
                savePNG(in_stack_00000060,in_stack_00000058,in_stack_00000057,in_stack_00000050,
                        in_stack_00000048,in_stack_00000044,in_stack_00000070,in_stack_00000078,
                        CONCAT44(in_stack_00000084,in_stack_00000080));
                std::__cxx11::string::~string(local_a8);
                return;
              }
            }
          }
        }
      }
    }
  }
LAB_0026d27d:
  std::__cxx11::string::string(local_58,in_RSI);
  savePNG(in_stack_00000060,in_stack_00000058,in_stack_00000057,in_stack_00000050,in_stack_00000048,
          in_stack_00000044,in_stack_00000070,in_stack_00000078,
          CONCAT44(in_stack_00000084,in_stack_00000080));
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void CommandExtract::saveImageFile(
        std::string filepath, bool appendExtension,
        const char* data, std::size_t size,
        VkFormat vkFormat, const FormatDescriptor& format, uint32_t width, uint32_t height) {

    switch (vkFormat) {
    case VK_FORMAT_A8_UNORM_KHR: [[fallthrough]];
    case VK_FORMAT_R8_UNORM: [[fallthrough]];
    case VK_FORMAT_R8_SRGB: [[fallthrough]];
    case VK_FORMAT_R8G8_UNORM: [[fallthrough]];
    case VK_FORMAT_R8G8_SRGB: [[fallthrough]];
    case VK_FORMAT_R8G8B8_UNORM: [[fallthrough]];
    case VK_FORMAT_R8G8B8_SRGB: [[fallthrough]];
    case VK_FORMAT_B8G8R8_UNORM: [[fallthrough]];
    case VK_FORMAT_B8G8R8_SRGB: [[fallthrough]];
    case VK_FORMAT_A8B8G8R8_UNORM_PACK32: [[fallthrough]];
    case VK_FORMAT_A8B8G8R8_SRGB_PACK32: [[fallthrough]];
    case VK_FORMAT_R8G8B8A8_UNORM: [[fallthrough]];
    case VK_FORMAT_R8G8B8A8_SRGB: [[fallthrough]];
    case VK_FORMAT_B8G8R8A8_UNORM: [[fallthrough]];
    case VK_FORMAT_B8G8R8A8_SRGB:
        savePNG(std::move(filepath), appendExtension, vkFormat, format, width, height, data, size);
        break;

    case VK_FORMAT_ASTC_4x4_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x6_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x6_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x8_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x8_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x6_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x6_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x8_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x8_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x10_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x10_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x10_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x10_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x12_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x12_SRGB_BLOCK:
        // ASTC decode will recurse into this function with the uncompressed data and format
        decodeAndSaveASTC(std::move(filepath), appendExtension, vkFormat, format, width, height, data, size);
        break;

    case VK_FORMAT_R4G4_UNORM_PACK8: [[fallthrough]];
    case VK_FORMAT_R5G6B5_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_B5G6R5_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_R4G4B4A4_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_B4G4R4A4_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_R5G5B5A1_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_B5G5R5A1_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_A1R5G5B5_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_A1B5G5R5_UNORM_PACK16_KHR: [[fallthrough]];
    case VK_FORMAT_A4R4G4B4_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_A4B4G4R4_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_R10X6_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_R10X6G10X6_UNORM_2PACK16: [[fallthrough]];
    case VK_FORMAT_R10X6G10X6B10X6A10X6_UNORM_4PACK16: [[fallthrough]];
    case VK_FORMAT_R12X4_UNORM_PACK16: [[fallthrough]];
    case VK_FORMAT_R12X4G12X4_UNORM_2PACK16: [[fallthrough]];
    case VK_FORMAT_R12X4G12X4B12X4A12X4_UNORM_4PACK16: [[fallthrough]];
    case VK_FORMAT_R16_UNORM: [[fallthrough]];
    case VK_FORMAT_R16G16_UNORM: [[fallthrough]];
    case VK_FORMAT_R16G16B16_UNORM: [[fallthrough]];
    case VK_FORMAT_R16G16B16A16_UNORM: [[fallthrough]];
    case VK_FORMAT_A2R10G10B10_UNORM_PACK32: [[fallthrough]];
    case VK_FORMAT_A2B10G10R10_UNORM_PACK32:
        savePNG(std::move(filepath), appendExtension, vkFormat, format, width, height, data, size);
        break;

    case VK_FORMAT_G8B8G8R8_422_UNORM: [[fallthrough]];
    case VK_FORMAT_B8G8R8G8_422_UNORM: [[fallthrough]];
    case VK_FORMAT_G10X6B10X6G10X6R10X6_422_UNORM_4PACK16: [[fallthrough]];
    case VK_FORMAT_B10X6G10X6R10X6G10X6_422_UNORM_4PACK16: [[fallthrough]];
    case VK_FORMAT_G12X4B12X4G12X4R12X4_422_UNORM_4PACK16: [[fallthrough]];
    case VK_FORMAT_B12X4G12X4R12X4G12X4_422_UNORM_4PACK16: [[fallthrough]];
    case VK_FORMAT_G16B16G16R16_422_UNORM: [[fallthrough]];
    case VK_FORMAT_B16G16R16G16_422_UNORM:
        // Unpack and save 4:2:2 formats as UNORM8, UNORM10X6, UNORM12X4 or UNORM16 formats
        unpackAndSave422(std::move(filepath), appendExtension, vkFormat, format, width, height, data, size);
        break;

    // EXR

    case VK_FORMAT_R8_UINT: [[fallthrough]];
    case VK_FORMAT_R8_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;
    case VK_FORMAT_R16_UINT: [[fallthrough]];
    case VK_FORMAT_R16_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_FLOAT, data, size);
        break;
    case VK_FORMAT_R32_UINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_UINT, data, size);
        break;
    case VK_FORMAT_R8G8_UINT: [[fallthrough]];
    case VK_FORMAT_R8G8_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;
    case VK_FORMAT_R16G16_UINT: [[fallthrough]];
    case VK_FORMAT_R16G16_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_FLOAT, data, size);
        break;
    case VK_FORMAT_R32G32_UINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_UINT, data, size);
        break;
    case VK_FORMAT_R8G8B8_UINT: [[fallthrough]];
    case VK_FORMAT_R8G8B8_SINT: [[fallthrough]];
    case VK_FORMAT_B8G8R8_UINT: [[fallthrough]];
    case VK_FORMAT_B8G8R8_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;
    case VK_FORMAT_R16G16B16_UINT: [[fallthrough]];
    case VK_FORMAT_R16G16B16_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_FLOAT, data, size);
        break;
    case VK_FORMAT_R32G32B32_UINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_UINT, data, size);
        break;
    case VK_FORMAT_R8G8B8A8_UINT: [[fallthrough]];
    case VK_FORMAT_R8G8B8A8_SINT: [[fallthrough]];
    case VK_FORMAT_B8G8R8A8_UINT: [[fallthrough]];
    case VK_FORMAT_B8G8R8A8_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;
    case VK_FORMAT_R16G16B16A16_UINT: [[fallthrough]];
    case VK_FORMAT_R16G16B16A16_SINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_FLOAT, data, size);
        break;
    case VK_FORMAT_R32G32B32A32_UINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_UINT, data, size);
        break;

    case VK_FORMAT_A2R10G10B10_UINT_PACK32: [[fallthrough]];
    case VK_FORMAT_A2R10G10B10_SINT_PACK32: [[fallthrough]];
    case VK_FORMAT_A2B10G10R10_UINT_PACK32: [[fallthrough]];
    case VK_FORMAT_A2B10G10R10_SINT_PACK32:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;

    case VK_FORMAT_R16_SFLOAT: [[fallthrough]];
    case VK_FORMAT_R16G16_SFLOAT: [[fallthrough]];
    case VK_FORMAT_R16G16B16_SFLOAT: [[fallthrough]];
    case VK_FORMAT_R16G16B16A16_SFLOAT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;
    case VK_FORMAT_R32_SFLOAT: [[fallthrough]];
    case VK_FORMAT_R32G32_SFLOAT: [[fallthrough]];
    case VK_FORMAT_R32G32B32_SFLOAT: [[fallthrough]];
    case VK_FORMAT_R32G32B32A32_SFLOAT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_FLOAT, data, size);
        break;

    case VK_FORMAT_B10G11R11_UFLOAT_PACK32:
    case VK_FORMAT_E5B9G9R9_UFLOAT_PACK32:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;

    case VK_FORMAT_D16_UNORM:
        savePNG(std::move(filepath), appendExtension, vkFormat, format, width, height, data, size);
        break;

    case VK_FORMAT_X8_D24_UNORM_PACK32: [[fallthrough]];
    case VK_FORMAT_D32_SFLOAT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_FLOAT, data, size);
        break;
    case VK_FORMAT_S8_UINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, TINYEXR_PIXELTYPE_HALF, data, size);
        break;
    case VK_FORMAT_D16_UNORM_S8_UINT: [[fallthrough]];
    case VK_FORMAT_D24_UNORM_S8_UINT: [[fallthrough]];
    case VK_FORMAT_D32_SFLOAT_S8_UINT:
        saveEXR(std::move(filepath), appendExtension, vkFormat, format, width, height, {TINYEXR_PIXELTYPE_FLOAT, TINYEXR_PIXELTYPE_HALF}, data, size);
        break;

    default:
        fatal(rc::INVALID_FILE, "Requested format conversion from {} is not supported.", toString(vkFormat));
    }
}